

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall
denialofservice_tests::block_relay_only_eviction::test_method(block_relay_only_eviction *this)

{
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  Options opts;
  pointer ppCVar1;
  bool bVar2;
  CChainParams *params;
  CConnman *pCVar3;
  int64_t iVar4;
  time_point tVar5;
  pointer ppCVar6;
  bool bVar7;
  iterator pvVar8;
  iterator pvVar9;
  long lVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  vector<CNode_*,_std::allocator<CNode_*>_> vNodes;
  __single_object connman;
  NodeId id;
  check_type cVar11;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  lazy_ostream local_1f0;
  undefined1 *local_1e0;
  char **local_1d8;
  assertion_result local_1d0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  vector<CNode_*,_std::allocator<CNode_*>_> local_198;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined2 uStack_16c;
  undefined4 local_168;
  undefined1 local_160 [16];
  NodeId local_150;
  undefined1 local_148 [48];
  uint64_t local_118;
  seconds local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_f0;
  vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> local_d8;
  vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> local_c0;
  vector<CService,_std::allocator<CService>_> local_a8;
  vector<CService,_std::allocator<CService>_> local_90;
  bool local_77;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_58;
  undefined2 local_3f;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_150 = 0;
  addrman_in = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  params = Params();
  pCVar3 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(pCVar3,0x1337,0x1337,addrman_in,netgroupman,params,true);
  local_178 = 0;
  uStack_174 = 100;
  uStack_170 = 100;
  uStack_16c = 0;
  local_168 = 2000;
  _cVar11 = (check_type)((ulong)CONCAT42(100,uStack_176) << 0x10);
  opts._8_8_ = (undefined8)_cVar11;
  opts._0_8_ = (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  opts.max_headers_result = 100;
  local_160._8_8_ = pCVar3;
  PeerManager::make((CConnman *)local_160,(AddrMan *)pCVar3,
                    (BanMan *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_OutboundTest).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  local_148._0_8_ = (__pthread_internal_list *)0x0;
  local_148._16_8_ = 0;
  local_148._24_8_ = (NetEventsInterface *)0x0;
  local_148._32_8_ = (BanMan *)0x0;
  local_148._40_8_ = 0;
  local_118 = 0;
  local_110.__r = 0x3c;
  memset(&local_108,0,0x90);
  local_77 = true;
  local_3f = 0x100;
  local_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (_Elt_pointer)0x0;
  local_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (_Elt_pointer)0x0;
  local_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_Elt_pointer)0x0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._8_4_ = 0x7d;
  CConnman::Init((CConnman *)local_160._8_8_,(Options *)local_148);
  local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    pvVar8 = (iterator)0x4;
    pCVar3 = (CConnman *)local_160._8_8_;
    OutboundTest::AddRandomOutboundPeer
              (&this->super_OutboundTest,&local_150,&local_198,(PeerManager *)local_160._0_8_,
               (ConnmanTestMsg *)local_160._8_8_,BLOCK_RELAY,false);
    bVar2 = false;
  } while (bVar7);
  (**(code **)(*(long *)local_160._0_8_ + 0xa0))();
  lVar10 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    local_1a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x105;
    file.m_begin = (iterator)&local_1a8;
    msg.m_end = pvVar8;
    msg.m_begin = (iterator)pCVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_200 = "vNodes[i]->fDisconnect == false";
    local_1f8 = "";
    local_1f0.m_empty = false;
    local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_1e0 = boost::unit_test::lazy_ostream::inst;
    local_1d8 = &local_200;
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_208 = "";
    pCVar3 = (CConnman *)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_210,0x105);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    lVar10 = 1;
    bVar2 = false;
  } while (bVar7);
  pvVar8 = (iterator)0x4;
  pCVar3 = (CConnman *)local_160._8_8_;
  OutboundTest::AddRandomOutboundPeer
            (&this->super_OutboundTest,&local_150,&local_198,(PeerManager *)local_160._0_8_,
             (ConnmanTestMsg *)local_160._8_8_,BLOCK_RELAY,false);
  (**(code **)(*(long *)local_160._0_8_ + 0xa0))();
  lVar10 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x10e;
    file_00.m_begin = (iterator)&local_220;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = (iterator)pCVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
               msg_00);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_200 = "vNodes[i]->fDisconnect == false";
    local_1f8 = "";
    local_1f0.m_empty = false;
    local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_1e0 = boost::unit_test::lazy_ostream::inst;
    local_1d8 = &local_200;
    local_240 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_238 = "";
    pCVar3 = (CConnman *)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_240,0x10e);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    lVar10 = 1;
    bVar2 = false;
  } while (bVar7);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x110;
  file_01.m_begin = (iterator)&local_250;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = (iterator)pCVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "vNodes.back()->fDisconnect == false";
  local_1f8 = "";
  local_1f0.m_empty = false;
  local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_268 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_270,0x110);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  iVar4 = GetTime();
  SetMockTime(iVar4 + 0x1f);
  (**(code **)(*(long *)local_160._0_8_ + 0xa0))();
  lVar10 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x115;
    file_02.m_begin = (iterator)&local_280;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
               msg_02);
    local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (~(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10]->fDisconnect)._M_base._M_i & 1);
    local_1d0.m_message.px = (element_type *)0x0;
    local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_200 = "vNodes[i]->fDisconnect == false";
    local_1f8 = "";
    local_1f0.m_empty = false;
    local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_1e0 = boost::unit_test::lazy_ostream::inst;
    local_1d8 = &local_200;
    local_2a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_298 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_2a0,0x115);
    boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    lVar10 = 1;
    bVar2 = false;
  } while (bVar7);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x117;
  file_03.m_begin = (iterator)&local_2b0;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c0,
             msg_03);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "vNodes.back()->fDisconnect == true";
  local_1f8 = "";
  local_1f0.m_empty = false;
  local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2c8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_2d0,0x117);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  LOCK();
  (local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_finish[-1]->fDisconnect)._M_base._M_i = false;
  UNLOCK();
  tVar5 = NodeClock::now();
  LOCK();
  (local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
   _M_finish[-1]->m_last_block_time)._M_i.__r = (long)tVar5.__d.__r / 1000000000;
  UNLOCK();
  (**(code **)(*(long *)local_160._0_8_ + 0xa0))();
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x120;
  file_04.m_begin = (iterator)&local_2e0;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~((*local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start)->fDisconnect)._M_base._M_i & 1);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "vNodes[i]->fDisconnect == false";
  local_1f8 = "";
  local_1f0.m_empty = false;
  local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2f8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_300,0x120);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x122;
  file_05.m_begin = (iterator)&local_310;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320,
             msg_05);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_start[1]->fDisconnect)._M_base._M_i & 1);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "vNodes[max_outbound_block_relay - 1]->fDisconnect == true";
  local_1f8 = "";
  local_1f0.m_empty = false;
  local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_328 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_330,0x122);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x123;
  file_06.m_begin = (iterator)&local_340;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_350,
             msg_06);
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (~(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->fDisconnect)._M_base._M_i & 1);
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "vNodes.back()->fDisconnect == false";
  local_1f8 = "";
  local_1f0.m_empty = false;
  local_1f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_358 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_1f0,1,0,WARN,_cVar11,(size_t)&local_360,0x123);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  ppCVar1 = local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar6 = local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar6 != ppCVar1; ppCVar6 = ppCVar6 + 1) {
    (*((NetEventsInterface *)(local_160._0_8_ + 8))->_vptr_NetEventsInterface[1])
              ((NetEventsInterface *)(local_160._0_8_ + 8),*ppCVar6);
  }
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)local_160._8_8_);
  if (local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_90);
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_a8);
  std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>::~vector(&local_c0)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector(&local_d8)
  ;
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector(&local_f0)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if ((PeerManager *)local_160._0_8_ != (PeerManager *)0x0) {
    (**(code **)(*(long *)local_160._0_8_ + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)(local_160 + 8));
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == (__pthread_internal_list *)local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(block_relay_only_eviction, OutboundTest)
{
    NodeId id{0};
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    constexpr int max_outbound_block_relay{MAX_BLOCK_RELAY_ONLY_CONNECTIONS};
    constexpr int64_t MINIMUM_CONNECT_TIME{30};
    CConnman::Options options;
    options.m_max_automatic_connections = DEFAULT_MAX_PEER_CONNECTIONS;

    connman->Init(options);
    std::vector<CNode*> vNodes;

    // Add block-relay-only peers up to the limit
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    }
    peerLogic->CheckForStaleTipAndEvictPeers();

    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }

    // Add an extra block-relay-only peer breaking the limit (mocks logic in ThreadOpenConnections)
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    peerLogic->CheckForStaleTipAndEvictPeers();

    // The extra peer should only get marked for eviction after MINIMUM_CONNECT_TIME
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    SetMockTime(GetTime() + MINIMUM_CONNECT_TIME + 1);
    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == true);

    // Update the last block time for the extra peer,
    // and check that the next youngest peer gets evicted.
    vNodes.back()->fDisconnect = false;
    vNodes.back()->m_last_block_time = GetTime<std::chrono::seconds>();

    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay - 1; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes[max_outbound_block_relay - 1]->fDisconnect == true);
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    for (const CNode* node : vNodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}